

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::beginAnimatedOperation(QTreeViewPrivate *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pQVar5;
  int item;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  int i;
  int c;
  int h;
  int limit;
  QTreeView *q;
  QRect rect;
  QRect *in_stack_ffffffffffffff78;
  State state;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_70;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  undefined4 in_stack_ffffffffffffff9c;
  QPixmap local_50 [16];
  QRect *in_stack_ffffffffffffffc0;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QVar6 = QWidget::rect((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  AnimatedOperation::top((AnimatedOperation *)in_RDI);
  QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  iVar3 = QAbstractAnimation::direction();
  if (iVar3 == 0) {
    iVar3 = QRect::height(in_stack_ffffffffffffff78);
    iVar3 = iVar3 << 1;
    iVar7 = 0;
    in_stack_ffffffffffffff84 = (in_RDI->animatedOperation).item;
    pQVar5 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (qsizetype)in_stack_ffffffffffffff78);
    item = in_stack_ffffffffffffff84 + ((uint)(*(ulong *)&pQVar5->field_0x1c >> 4) & 0xfffffff) + 1;
    local_70 = (in_RDI->animatedOperation).item;
    while( true ) {
      local_70 = local_70 + 1;
      uVar1 = in_stack_ffffffffffffff80 & 0xffffff;
      if (local_70 < item) {
        uVar1 = CONCAT13(iVar7 < iVar3,(int3)in_stack_ffffffffffffff80);
      }
      in_stack_ffffffffffffff80 = uVar1;
      if ((char)(in_stack_ffffffffffffff80 >> 0x18) == '\0') break;
      iVar4 = itemHeight((QTreeViewPrivate *)CONCAT44(iVar3,iVar7),item);
      iVar7 = iVar4 + iVar7;
    }
    QRect::setHeight((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    in_stack_ffffffffffffff78 = (QRect *)&in_RDI->animatedOperation;
    iVar3 = AnimatedOperation::top((AnimatedOperation *)in_RDI);
    ::QVariant::QVariant(&local_28,iVar3 + iVar7);
    QVariantAnimation::setEndValue((QVariant *)in_stack_ffffffffffffff78);
    ::QVariant::~QVariant(&local_28);
  }
  state = (State)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  bVar2 = QRect::isEmpty((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (!bVar2) {
    renderTreeToPixmapForAnimation(QVar6._0_8_,in_stack_ffffffffffffffc0);
    QPixmap::operator=((QPixmap *)in_RDI,
                       (QPixmap *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    iVar3 = (int)in_RDI;
    QPixmap::~QPixmap(local_50);
    QAbstractItemView::setState
              ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               state);
    QAbstractAnimation::start(iVar3 + 0x540);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::beginAnimatedOperation()
{
    Q_Q(QTreeView);

    QRect rect = viewport->rect();
    rect.setTop(animatedOperation.top());
    if (animatedOperation.direction() == QVariantAnimation::Forward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = animatedOperation.item + viewItems.at(animatedOperation.item).total + 1;
        for (int i = animatedOperation.item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(animatedOperation.top() + h);
    }

    if (!rect.isEmpty()) {
        animatedOperation.after = renderTreeToPixmapForAnimation(rect);

        q->setState(QAbstractItemView::AnimatingState);
        animatedOperation.start(); //let's start the animation
    }
}